

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_2,_3>,_tcu::Matrix<double,_3,_2>_>::call
          (unary<tcu::Matrix<double,_2,_3>,_tcu::Matrix<double,_3,_2>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  Matrix<double,_3,_2> arg;
  Matrix<double,_2,_3> result;
  Matrix<double,_2,_3> MStack_b8;
  Matrix<double,_3,_2> local_88;
  Matrix<double,_2,_3> local_58;
  
  tcu::Matrix<double,_2,_3>::Matrix(&local_58);
  tcu::Matrix<double,_3,_2>::Matrix(&local_88);
  unpack<tcu::Matrix<double,_3,_2>_>::get(argument_src,&local_88);
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&MStack_b8,&local_88);
  tcu::Matrix<double,_2,_3>::operator=(&local_58,&MStack_b8);
  pack<tcu::Matrix<double,_2,_3>_>::set(result_dst,&local_58);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}